

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  pointer *ppp_Var1;
  iterator __position;
  internals *piVar2;
  _object *local_10;
  
  piVar2 = get_internals();
  local_10 = (_object *)0x0;
  __position._M_current =
       (piVar2->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (piVar2->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<_object*,std::allocator<_object*>>::_M_realloc_insert<_object*>
              ((vector<_object*,std::allocator<_object*>> *)&piVar2->loader_patient_stack,__position
               ,&local_10);
  }
  else {
    *__position._M_current = (_object *)0x0;
    ppp_Var1 = &(piVar2->loader_patient_stack).
                super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppp_Var1 = *ppp_Var1 + 1;
  }
  return;
}

Assistant:

loader_life_support() {
        get_internals().loader_patient_stack.push_back(nullptr);
    }